

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_taproot.cpp
# Opt level: O2

void __thiscall cfd::core::TapBranch::AddBranch(TapBranch *this,SchnorrPubkey *pubkey)

{
  _Vector_base<unsigned_char,_std::allocator<unsigned_char>_> _Stack_28;
  
  SchnorrPubkey::GetByteData256((ByteData256 *)&_Stack_28,pubkey);
  (*this->_vptr_TapBranch[3])(this,&_Stack_28);
  ::std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base(&_Stack_28);
  return;
}

Assistant:

void TapBranch::AddBranch(const SchnorrPubkey& pubkey) {
  AddBranch(pubkey.GetByteData256());
}